

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenGlobalInitializer::GetOrCreateGlobalTarget
          (cmQtAutoGenGlobalInitializer *this,cmLocalGenerator *localGen,string *name,
          string *comment)

{
  cmMakefile *this_00;
  __single_object this_01;
  cmGeneratorTarget *pcVar1;
  string *psVar2;
  cmTarget *pcVar3;
  cmState *this_02;
  cmValue value;
  allocator<char> local_71;
  __single_object cc;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> local_68;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_60;
  string local_58;
  cmTarget *target;
  cmLocalGenerator *localGen_local;
  
  localGen_local = localGen;
  pcVar1 = cmLocalGenerator::FindGeneratorTargetToUse(localGen,name);
  if (pcVar1 == (cmGeneratorTarget *)0x0) {
    this_00 = localGen->Makefile;
    std::make_unique<cmCustomCommand>();
    this_01 = cc;
    psVar2 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_(this_00);
    cmCustomCommand::SetWorkingDirectory
              ((cmCustomCommand *)
               this_01._M_t.
               super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
               super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
               super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
               (psVar2->_M_dataplus)._M_p);
    cmCustomCommand::SetEscapeOldStyle
              ((cmCustomCommand *)
               cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
               super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,false);
    cmCustomCommand::SetComment
              ((cmCustomCommand *)
               cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
               super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
               (comment->_M_dataplus)._M_p);
    local_60._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t
    .super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
         super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
         super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
    cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
    super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         (__uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>)0x0;
    pcVar3 = cmLocalGenerator::AddUtilityCommand(localGen,name,true,&local_60);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_60);
    target = pcVar3;
    std::make_unique<cmGeneratorTarget,cmTarget*&,cmLocalGenerator*&>
              ((cmTarget **)&local_68,(cmLocalGenerator **)&target);
    cmLocalGenerator::AddGeneratorTarget(localGen,&local_68);
    std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
              (&local_68);
    this_02 = cmMakefile::GetState(this_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"AUTOGEN_TARGETS_FOLDER",&local_71);
    value = cmState::GetGlobalProperty(this_02,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    pcVar3 = target;
    if (value.Value != (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"FOLDER",&local_71);
      cmTarget::SetProperty(pcVar3,&local_58,value);
      std::__cxx11::string::~string((string *)&local_58);
    }
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&cc);
  }
  return;
}

Assistant:

void cmQtAutoGenGlobalInitializer::GetOrCreateGlobalTarget(
  cmLocalGenerator* localGen, std::string const& name,
  std::string const& comment)
{
  // Test if the target already exists
  if (localGen->FindGeneratorTargetToUse(name) == nullptr) {
    cmMakefile const* makefile = localGen->GetMakefile();

    // Create utility target
    auto cc = cm::make_unique<cmCustomCommand>();
    cc->SetWorkingDirectory(makefile->GetHomeOutputDirectory().c_str());
    cc->SetEscapeOldStyle(false);
    cc->SetComment(comment.c_str());
    cmTarget* target = localGen->AddUtilityCommand(name, true, std::move(cc));
    localGen->AddGeneratorTarget(
      cm::make_unique<cmGeneratorTarget>(target, localGen));

    // Set FOLDER property in the target
    {
      cmValue folder =
        makefile->GetState()->GetGlobalProperty("AUTOGEN_TARGETS_FOLDER");
      if (folder) {
        target->SetProperty("FOLDER", folder);
      }
    }
  }
}